

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::End(void)

{
  ImGuiLastItemData *pIVar1;
  float *pfVar2;
  ImRect *pIVar3;
  ImVec2 IVar4;
  int iVar5;
  ImGuiWindow *pIVar6;
  ImGuiWindowStackData *pIVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  ImGuiID IVar12;
  ImGuiItemFlags IVar13;
  ImGuiContext *pIVar14;
  ImGuiItemStatusFlags IVar15;
  ImGuiContext *pIVar16;
  int iVar17;
  ImGuiWindow *pIVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  
  pIVar14 = GImGui;
  pIVar18 = GImGui->CurrentWindow;
  if (((GImGui->CurrentWindowStack).Size < 2) &&
     (GImGui->WithinFrameScopeWithImplicitWindow != false)) {
    return;
  }
  if ((pIVar18->DC).CurrentColumns != (ImGuiOldColumns *)0x0) {
    EndColumns();
  }
  PopClipRect();
  pIVar16 = GImGui;
  iVar5 = (GImGui->FocusScopeStack).Size;
  iVar17 = iVar5 + -1;
  (GImGui->FocusScopeStack).Size = iVar17;
  if (iVar17 == 0) {
    uVar19 = 0;
  }
  else {
    uVar19 = (pIVar16->FocusScopeStack).Data[(long)iVar5 + -2];
  }
  pIVar16->CurrentFocusScopeId = uVar19;
  if ((pIVar18->Flags & 0x1000000) == 0) {
    LogFinish();
  }
  if ((pIVar18->DC).IsSetPos == true) {
    pIVar6 = GImGui->CurrentWindow;
    (pIVar6->DC).IsSetPos = false;
    IVar4 = (pIVar6->DC).CursorPos;
    fVar21 = IVar4.x;
    fVar22 = IVar4.y;
    IVar4 = (pIVar6->DC).CursorMaxPos;
    fVar23 = IVar4.x;
    fVar24 = IVar4.y;
    uVar19 = -(uint)(fVar21 <= fVar23);
    uVar20 = -(uint)(fVar22 <= fVar24);
    (pIVar6->DC).CursorMaxPos =
         (ImVec2)(CONCAT44(~uVar20 & (uint)fVar22,~uVar19 & (uint)fVar21) |
                 CONCAT44((uint)fVar24 & uVar20,(uint)fVar23 & uVar19));
  }
  pIVar7 = (pIVar14->CurrentWindowStack).Data;
  iVar5 = (pIVar14->CurrentWindowStack).Size;
  pIVar1 = &pIVar7[(long)iVar5 + -1].ParentLastItemDataBackup;
  IVar12 = pIVar1->ID;
  IVar13 = pIVar1->InFlags;
  IVar15 = pIVar1->StatusFlags;
  fVar21 = (pIVar1->Rect).Min.x;
  pfVar2 = &pIVar7[(long)iVar5 + -1].ParentLastItemDataBackup.Rect.Min.y;
  uVar8 = *(undefined8 *)pfVar2;
  uVar9 = *(undefined8 *)(pfVar2 + 2);
  pfVar2 = &pIVar7[(long)iVar5 + -1].ParentLastItemDataBackup.NavRect.Min.y;
  uVar10 = *(undefined8 *)pfVar2;
  uVar11 = *(undefined8 *)(pfVar2 + 2);
  pIVar3 = &pIVar7[(long)iVar5 + -1].ParentLastItemDataBackup.DisplayRect;
  IVar4 = pIVar3->Max;
  (pIVar14->LastItemData).DisplayRect.Min = pIVar3->Min;
  (pIVar14->LastItemData).DisplayRect.Max = IVar4;
  *(undefined8 *)&(pIVar14->LastItemData).NavRect.Min.y = uVar10;
  *(undefined8 *)&(pIVar14->LastItemData).NavRect.Max.y = uVar11;
  *(undefined8 *)&(pIVar14->LastItemData).Rect.Min.y = uVar8;
  *(undefined8 *)&(pIVar14->LastItemData).Rect.Max.y = uVar9;
  (pIVar14->LastItemData).ID = IVar12;
  (pIVar14->LastItemData).InFlags = IVar13;
  (pIVar14->LastItemData).StatusFlags = IVar15;
  (pIVar14->LastItemData).Rect.Min.x = fVar21;
  if ((pIVar18->Flags & 0x10000000) != 0) {
    pIVar14->BeginMenuCount = pIVar14->BeginMenuCount + -1;
  }
  if ((pIVar18->Flags & 0x4000000) != 0) {
    (pIVar14->BeginPopupStack).Size = (pIVar14->BeginPopupStack).Size + -1;
  }
  (pIVar14->CurrentWindowStack).Size = iVar5 + -1;
  if (iVar5 + -1 == 0) {
    pIVar18 = (ImGuiWindow *)0x0;
  }
  else {
    pIVar18 = (pIVar14->CurrentWindowStack).Data[(long)iVar5 + -2].Window;
  }
  SetCurrentWindow(pIVar18);
  return;
}

Assistant:

void ImGui::End()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    // Error checking: verify that user hasn't called End() too many times!
    if (g.CurrentWindowStack.Size <= 1 && g.WithinFrameScopeWithImplicitWindow)
    {
        IM_ASSERT_USER_ERROR(g.CurrentWindowStack.Size > 1, "Calling End() too many times!");
        return;
    }
    IM_ASSERT(g.CurrentWindowStack.Size > 0);

    // Error checking: verify that user doesn't directly call End() on a child window.
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        IM_ASSERT_USER_ERROR(g.WithinEndChild, "Must call EndChild() and not End()!");

    // Close anything that is open
    if (window->DC.CurrentColumns)
        EndColumns();
    PopClipRect();   // Inner window clip rectangle
    PopFocusScope();

    // Stop logging
    if (!(window->Flags & ImGuiWindowFlags_ChildWindow))    // FIXME: add more options for scope of logging
        LogFinish();

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    // Pop from window stack
    g.LastItemData = g.CurrentWindowStack.back().ParentLastItemDataBackup;
    if (window->Flags & ImGuiWindowFlags_ChildMenu)
        g.BeginMenuCount--;
    if (window->Flags & ImGuiWindowFlags_Popup)
        g.BeginPopupStack.pop_back();
    g.CurrentWindowStack.back().StackSizesOnBegin.CompareWithCurrentState();
    g.CurrentWindowStack.pop_back();
    SetCurrentWindow(g.CurrentWindowStack.Size == 0 ? NULL : g.CurrentWindowStack.back().Window);
}